

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

extent_t * extent_heap_first(extent_heap_t *ph)

{
  void *pvVar1;
  void *pvVar2;
  extent_t *peVar3;
  extent_t *peVar4;
  extent_t *peVar5;
  extent_t *peVar6;
  extent_t *peVar7;
  uintptr_t a_addr_3;
  extent_t *peVar8;
  int iVar9;
  extent_t *peVar10;
  uintptr_t a_addr;
  ulong uVar11;
  ulong uVar12;
  uintptr_t a_addr_1;
  
  peVar5 = ph->ph_root;
  if (peVar5 == (extent_t *)0x0) {
    return (extent_t *)0x0;
  }
  peVar7 = (peVar5->ph_link).phn_next;
  if (peVar7 != (extent_t *)0x0) {
    (peVar5->ph_link).phn_prev = (extent_t *)0x0;
    (peVar5->ph_link).phn_next = (extent_t *)0x0;
    (peVar7->ph_link).phn_prev = (extent_t *)0x0;
    peVar8 = (peVar7->ph_link).phn_next;
    if (peVar8 != (extent_t *)0x0) {
      peVar10 = (peVar8->ph_link).phn_next;
      if (peVar10 != (extent_t *)0x0) {
        (peVar10->ph_link).phn_prev = (extent_t *)0x0;
      }
      (peVar7->ph_link).phn_prev = (extent_t *)0x0;
      (peVar7->ph_link).phn_next = (extent_t *)0x0;
      (peVar8->ph_link).phn_prev = (extent_t *)0x0;
      (peVar8->ph_link).phn_next = (extent_t *)0x0;
      uVar11 = peVar7->e_bits >> 0x2a;
      uVar12 = peVar8->e_bits >> 0x2a;
      iVar9 = (uint)(uVar12 < uVar11) - (uint)(uVar11 < uVar12);
      if (iVar9 == 0) {
        pvVar1 = peVar7->e_addr;
        pvVar2 = peVar8->e_addr;
        iVar9 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
      }
      if (iVar9 < 0) {
        (peVar8->ph_link).phn_prev = peVar7;
        peVar6 = (peVar7->ph_link).phn_lchild;
        (peVar8->ph_link).phn_next = peVar6;
        if (peVar6 != (extent_t *)0x0) {
          (peVar6->ph_link).phn_prev = peVar8;
        }
        (peVar7->ph_link).phn_lchild = peVar8;
        peVar8 = peVar7;
      }
      else {
        (peVar7->ph_link).phn_prev = peVar8;
        peVar6 = (peVar8->ph_link).phn_lchild;
        (peVar7->ph_link).phn_next = peVar6;
        if (peVar6 != (extent_t *)0x0) {
          (peVar6->ph_link).phn_prev = peVar7;
        }
        (peVar8->ph_link).phn_lchild = peVar7;
        peVar7 = peVar8;
      }
      while (peVar6 = peVar10, peVar6 != (extent_t *)0x0) {
        peVar3 = (peVar6->ph_link).phn_next;
        if (peVar3 == (extent_t *)0x0) {
          (peVar8->ph_link).phn_next = peVar6;
          peVar8 = peVar6;
          break;
        }
        peVar10 = (peVar3->ph_link).phn_next;
        if (peVar10 != (extent_t *)0x0) {
          (peVar10->ph_link).phn_prev = (extent_t *)0x0;
        }
        (peVar6->ph_link).phn_prev = (extent_t *)0x0;
        (peVar6->ph_link).phn_next = (extent_t *)0x0;
        (peVar3->ph_link).phn_prev = (extent_t *)0x0;
        (peVar3->ph_link).phn_next = (extent_t *)0x0;
        uVar12 = peVar6->e_bits >> 0x2a;
        uVar11 = peVar3->e_bits >> 0x2a;
        iVar9 = (uint)(uVar11 < uVar12) - (uint)(uVar12 < uVar11);
        if (iVar9 == 0) {
          pvVar1 = peVar6->e_addr;
          pvVar2 = peVar3->e_addr;
          iVar9 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
        }
        if (iVar9 < 0) {
          (peVar3->ph_link).phn_prev = peVar6;
          peVar4 = (peVar6->ph_link).phn_lchild;
          (peVar3->ph_link).phn_next = peVar4;
          if (peVar4 != (extent_t *)0x0) {
            (peVar4->ph_link).phn_prev = peVar3;
          }
          (peVar6->ph_link).phn_lchild = peVar3;
        }
        else {
          (peVar6->ph_link).phn_prev = peVar3;
          peVar4 = (peVar3->ph_link).phn_lchild;
          (peVar6->ph_link).phn_next = peVar4;
          if (peVar4 != (extent_t *)0x0) {
            (peVar4->ph_link).phn_prev = peVar6;
          }
          (peVar3->ph_link).phn_lchild = peVar6;
          peVar6 = peVar3;
        }
        (peVar8->ph_link).phn_next = peVar6;
        peVar8 = peVar6;
      }
      peVar10 = (peVar7->ph_link).phn_next;
      peVar6 = peVar7;
      if (peVar10 != (extent_t *)0x0) {
        while( true ) {
          peVar3 = (peVar10->ph_link).phn_next;
          (peVar6->ph_link).phn_next = (extent_t *)0x0;
          (peVar10->ph_link).phn_next = (extent_t *)0x0;
          uVar12 = peVar6->e_bits >> 0x2a;
          uVar11 = peVar10->e_bits >> 0x2a;
          iVar9 = (uint)(uVar11 < uVar12) - (uint)(uVar12 < uVar11);
          if (iVar9 == 0) {
            pvVar1 = peVar6->e_addr;
            pvVar2 = peVar10->e_addr;
            iVar9 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
          }
          if (iVar9 < 0) {
            (peVar10->ph_link).phn_prev = peVar6;
            peVar7 = (peVar6->ph_link).phn_lchild;
            (peVar10->ph_link).phn_next = peVar7;
            if (peVar7 != (extent_t *)0x0) {
              (peVar7->ph_link).phn_prev = peVar10;
            }
            (peVar6->ph_link).phn_lchild = peVar10;
            peVar7 = peVar6;
          }
          else {
            (peVar6->ph_link).phn_prev = peVar10;
            peVar7 = (peVar10->ph_link).phn_lchild;
            (peVar6->ph_link).phn_next = peVar7;
            if (peVar7 != (extent_t *)0x0) {
              (peVar7->ph_link).phn_prev = peVar6;
            }
            (peVar10->ph_link).phn_lchild = peVar6;
            peVar7 = peVar10;
          }
          if (peVar3 == (extent_t *)0x0) break;
          (peVar8->ph_link).phn_next = peVar7;
          peVar10 = (peVar3->ph_link).phn_next;
          peVar6 = peVar3;
          peVar8 = peVar7;
        }
      }
    }
    uVar11 = peVar5->e_bits >> 0x2a;
    uVar12 = peVar7->e_bits >> 0x2a;
    iVar9 = (uint)(uVar12 < uVar11) - (uint)(uVar11 < uVar12);
    if (iVar9 == 0) {
      pvVar1 = peVar5->e_addr;
      pvVar2 = peVar7->e_addr;
      iVar9 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
    }
    if (iVar9 < 0) {
      (peVar7->ph_link).phn_prev = peVar5;
      ph = (extent_heap_t *)&(peVar5->ph_link).phn_lchild;
      peVar8 = (peVar5->ph_link).phn_lchild;
      (peVar7->ph_link).phn_next = peVar8;
      if (peVar8 != (extent_t *)0x0) {
        (peVar8->ph_link).phn_prev = peVar7;
      }
    }
    else {
      (peVar5->ph_link).phn_prev = peVar7;
      peVar8 = (peVar7->ph_link).phn_lchild;
      (peVar5->ph_link).phn_next = peVar8;
      if (peVar8 != (extent_t *)0x0) {
        (peVar8->ph_link).phn_prev = peVar5;
      }
      (peVar7->ph_link).phn_lchild = peVar5;
      peVar5 = peVar7;
    }
    *ph = (extent_heap_t)peVar7;
  }
  return peVar5;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}